

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

absolute_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          Transition *tr)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  detail *this_00;
  undefined3 uVar6;
  const_reference pvVar7;
  char *pcVar8;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> a;
  fields fVar9;
  TransitionType *tt;
  Transition *tr_local;
  int_fast64_t unix_time_local;
  TimeZoneInfo *this_local;
  
  pvVar7 = std::
           vector<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
           ::operator[](&this->transition_types_,(ulong)tr->type_index);
  this_00 = (detail *)(tr->civil_sec).f_.y;
  uVar1 = (tr->civil_sec).f_.m;
  uVar2 = (tr->civil_sec).f_.d;
  uVar3 = (tr->civil_sec).f_.hh;
  uVar4 = (tr->civil_sec).f_.mm;
  uVar5 = (tr->civil_sec).f_.ss;
  uVar6 = *(undefined3 *)&(tr->civil_sec).f_.field_0xd;
  a.f_.y._5_3_ = uVar6;
  a.f_.y._4_1_ = uVar5;
  a.f_.y._3_1_ = uVar4;
  a.f_.y._2_1_ = uVar3;
  a.f_.y._1_1_ = uVar2;
  a.f_.y._0_1_ = uVar1;
  a.f_._8_8_ = unix_time - tr->unix_time;
  fVar9 = (fields)detail::operator+(this_00,a,(diff_t)this_00);
  (__return_storage_ptr__->cs).f_ = fVar9;
  __return_storage_ptr__->offset = pvVar7->utc_offset;
  __return_storage_ptr__->is_dst = (bool)(pvVar7->is_dst & 1);
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&this->abbreviations_);
  __return_storage_ptr__->abbr = pcVar8;
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(std::int_fast64_t unix_time,
                                                   const Transition& tr) const {
  const TransitionType& tt = transition_types_[tr.type_index];
  // Note: (unix_time - tr.unix_time) will never overflow as we
  // have ensured that there is always a "nearby" transition.
  return {tr.civil_sec + (unix_time - tr.unix_time),  // TODO: Optimize.
          tt.utc_offset, tt.is_dst, &abbreviations_[tt.abbr_index]};
}